

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void binaryFilter(Mat *image,double factor)

{
  _InputArray *p_Var1;
  byte *pbVar2;
  uchar *puVar3;
  Point_<int> local_d0;
  Point_<int> local_c8;
  Point_<int> local_c0;
  int local_b8;
  int local_b4;
  int y;
  int x;
  uchar threshold;
  _InputArray local_a0;
  double local_88;
  double max;
  double min;
  Mat out;
  int local_6c;
  double factor_local;
  Mat *image_local;
  
  cv::Mat::clone();
  cv::_InputArray::_InputArray(&local_a0,(Mat *)&min);
  p_Var1 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(&local_a0,&max,&local_88,(Point_ *)0x0,(Point_ *)0x0,p_Var1);
  cv::_InputArray::~_InputArray(&local_a0);
  y._3_1_ = (byte)(int)(local_88 * factor);
  for (local_b4 = 0; local_b4 < local_6c; local_b4 = local_b4 + 1) {
    for (local_b8 = 0; local_b8 < _out; local_b8 = local_b8 + 1) {
      cv::Point_<int>::Point_(&local_c0,local_b4,local_b8);
      pbVar2 = cv::Mat::at<unsigned_char>((Mat *)&min,&local_c0);
      if (y._3_1_ < *pbVar2) {
        cv::Point_<int>::Point_(&local_c8,local_b4,local_b8);
        puVar3 = cv::Mat::at<unsigned_char>((Mat *)&min,&local_c8);
        *puVar3 = 0xff;
      }
      else {
        cv::Point_<int>::Point_(&local_d0,local_b4,local_b8);
        puVar3 = cv::Mat::at<unsigned_char>((Mat *)&min,&local_d0);
        *puVar3 = '\0';
      }
    }
  }
  cv::Mat::operator=(image,(Mat *)&min);
  cv::Mat::~Mat((Mat *)&min);
  return;
}

Assistant:

void binaryFilter(cv::Mat & image, double factor) {
	cv::Mat out = image.clone();
	double min, max;
	cv::minMaxLoc(out, &min, &max);
	uchar threshold = (uchar)(max * factor);
	for (int x = 0; x < out.cols; x++)
	{
		for (int y = 0; y < out.rows; y++)
		{
			if (out.at<uchar>(cv::Point(x, y)) > threshold)
				out.at<uchar>(cv::Point(x, y)) = UCHAR_MAX;
			else
				out.at<uchar>(cv::Point(x, y)) = 0;
		}
	}
	image = out;
}